

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

void __thiscall flatbuffers::Parser::ParseSingleValue(Parser *this,Value *e)

{
  string *__rhs;
  bool bVar1;
  EnumVal *pEVar2;
  undefined8 extraout_RAX;
  int extraout_EDX;
  int extraout_EDX_00;
  int t;
  char *this_00;
  pointer ppEVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_68;
  string local_48;
  
  bVar1 = TryTypedValue(this,2,(e->type).base_type - BASE_TYPE_UTYPE < 0xc,e,BASE_TYPE_INT);
  if (!bVar1) {
    bVar1 = TryTypedValue(this,3,(e->type).base_type - BASE_TYPE_FLOAT < 2,e,BASE_TYPE_FLOAT);
    if (!bVar1) {
      bVar1 = TryTypedValue(this,1,(e->type).base_type == BASE_TYPE_STRING,e,BASE_TYPE_STRING);
      if (!bVar1) {
        this_00 = (char *)(ulong)(uint)this->token_;
        t = extraout_EDX;
        if (this->token_ != 4) {
LAB_001115a5:
          TokenToString_abi_cxx11_(&local_48,(flatbuffers *)this_00,t);
          std::operator+(&bStack_68,"cannot parse value starting with: ",&local_48);
          Error(&bStack_68);
          std::__cxx11::string::~string((string *)&bStack_68);
          std::__cxx11::string::~string((string *)&local_48);
          _Unwind_Resume(extraout_RAX);
        }
        ppEVar3 = (this->enums_).vec.
                  super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        __rhs = &this->attribute_;
        do {
          if (ppEVar3 ==
              (this->enums_).vec.
              super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            this_00 = "not valid enum value: ";
            std::operator+(&bStack_68,"not valid enum value: ",__rhs);
            Error(&bStack_68);
            t = extraout_EDX_00;
            goto LAB_001115a5;
          }
          pEVar2 = SymbolTable<flatbuffers::EnumVal>::Lookup(&(*ppEVar3)->vals,__rhs);
          ppEVar3 = ppEVar3 + 1;
        } while (pEVar2 == (EnumVal *)0x0);
        NumToString<int>(&bStack_68,pEVar2->value);
        std::__cxx11::string::operator=((string *)__rhs,(string *)&bStack_68);
        std::__cxx11::string::~string((string *)&bStack_68);
        TryTypedValue(this,4,(e->type).base_type - BASE_TYPE_UTYPE < 10,e,BASE_TYPE_INT);
      }
    }
  }
  return;
}

Assistant:

void Parser::ParseSingleValue(Value &e) {
  if (TryTypedValue(kTokenIntegerConstant,
                    IsScalar(e.type.base_type),
                    e,
                    BASE_TYPE_INT) ||
      TryTypedValue(kTokenFloatConstant,
                    IsFloat(e.type.base_type),
                    e,
                    BASE_TYPE_FLOAT) ||
      TryTypedValue(kTokenStringConstant,
                    e.type.base_type == BASE_TYPE_STRING,
                    e,
                    BASE_TYPE_STRING)) {
  } else if (token_ == kTokenIdentifier) {
    for (auto it = enums_.vec.begin(); it != enums_.vec.end(); ++it) {
      auto ev = (*it)->vals.Lookup(attribute_);
      if (ev) {
        attribute_ = NumToString(ev->value);
        TryTypedValue(kTokenIdentifier,
                      IsInteger(e.type.base_type),
                      e,
                      BASE_TYPE_INT);
        return;
      }
    }
    Error("not valid enum value: " + attribute_);
  } else {
    Error("cannot parse value starting with: " + TokenToString(token_));
  }
}